

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O0

void __thiscall
Memory::HeapBucketGroup<MediumAllocationBlockAttributes>::SweepPendingObjects
          (HeapBucketGroup<MediumAllocationBlockAttributes> *this,RecyclerSweep *recyclerSweep)

{
  code *pcVar1;
  bool bVar2;
  SmallLeafHeapBlockT<MediumAllocationBlockAttributes> **ppSVar3;
  undefined4 *puVar4;
  RecyclerSweep *recyclerSweep_local;
  HeapBucketGroup<MediumAllocationBlockAttributes> *this_local;
  
  ppSVar3 = RecyclerSweep::
            GetPendingSweepBlockList<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>>
                      (recyclerSweep,
                       &(this->leafHeapBucket).
                        super_HeapBucketT<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>_>
                      );
  if (*ppSVar3 != (SmallLeafHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                       ,0x904,"(recyclerSweep.GetPendingSweepBlockList(&leafHeapBucket) == nullptr)"
                       ,"recyclerSweep.GetPendingSweepBlockList(&leafHeapBucket) == nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  SmallNormalHeapBucketBase<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>::
  SweepPendingObjects((SmallNormalHeapBucketBase<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>
                       *)this,recyclerSweep);
  SmallNormalHeapBucketBase<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
  ::SweepPendingObjects
            (&(this->smallNormalWithBarrierHeapBucket).
              super_SmallNormalHeapBucketBase<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
             ,recyclerSweep);
  SmallNormalHeapBucketBase<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
  ::SweepPendingObjects
            ((SmallNormalHeapBucketBase<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
              *)&this->smallFinalizableWithBarrierHeapBucket,recyclerSweep);
  SmallNormalHeapBucketBase<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>::
  SweepPendingObjects((SmallNormalHeapBucketBase<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>
                       *)&this->finalizableHeapBucket,recyclerSweep);
  return;
}

Assistant:

void
HeapBucketGroup<TBlockAttributes>::SweepPendingObjects(RecyclerSweep& recyclerSweep)
{
    // For leaf buckets, we can always reuse the page as we don't need to rescan them for partial GC
    // It should have been swept immediately during Sweep
    // WriteBarrier-TODO: Do the same for write barrier buckets
    Assert(recyclerSweep.GetPendingSweepBlockList(&leafHeapBucket) == nullptr);

    heapBucket.SweepPendingObjects(recyclerSweep);
#ifdef RECYCLER_WRITE_BARRIER
    smallNormalWithBarrierHeapBucket.SweepPendingObjects(recyclerSweep);
    smallFinalizableWithBarrierHeapBucket.SweepPendingObjects(recyclerSweep);
#endif

    finalizableHeapBucket.SweepPendingObjects(recyclerSweep);
#ifdef RECYCLER_VISITED_HOST
    recyclerVisitedHostHeapBucket.SweepPendingObjects(recyclerSweep);
#endif
}